

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall
CTPNInh::gen_code_mminh
          (CTPNInh *this,CTcSymFunc *func,int discard,CTcPrsNode *prop_expr,int prop_is_expr,
          int argc,int varargs,CTcNamedArgs *named_args)

{
  char *pcVar1;
  CTcFormalTypeList *this_00;
  char *pcVar2;
  _func_int **pp_Var3;
  _func_int *UNRECOVERED_JUMPTABLE;
  size_t sVar4;
  CTcSymbol *pCVar5;
  undefined4 in_register_00000014;
  CTcSymFunc *pCVar6;
  undefined4 in_register_00000084;
  char *pcVar7;
  char *pcVar8;
  CTcToken btok;
  CTcToken local_80;
  CTcToken local_58;
  
  do {
    pCVar6 = func;
    func = (pCVar6->super_CTcSymFuncBase).mod_global_;
  } while (func != (CTcSymFunc *)0x0);
  this_00 = (this->super_CTPNInhBase).typelist_;
  if (this_00 == (CTcFormalTypeList *)0x0) {
    pp_Var3 = (pCVar6->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
              super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry;
    (*pp_Var3[0x18])(pCVar6,0,CONCAT44(in_register_00000014,discard),pp_Var3,
                     CONCAT44(in_register_00000084,prop_is_expr));
    pCVar5 = CTcPrsSymtab::find(G_prs->global_symtab_,"_multiMethodCallInherited",0x19,
                                (CTcPrsSymtab **)0x0);
    if ((pCVar5 != (CTcSymbol *)0x0) &&
       (*(int *)&(pCVar5->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 ==
        1)) {
      UNRECOVERED_JUMPTABLE =
           (pCVar5->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
           [0x1b];
      (*UNRECOVERED_JUMPTABLE)
                (pCVar5,(ulong)(uint)discard,(ulong)(argc + 1),(ulong)(uint)varargs,named_args,
                 UNRECOVERED_JUMPTABLE);
      return;
    }
    CTcTokenizer::log_error(0x2d27,0x19,"_multiMethodCallInherited");
    return;
  }
  pcVar2 = (pCVar6->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
           super_CVmHashEntry.str_;
  sVar4 = (pCVar6->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
          super_CVmHashEntry.len_;
  pcVar8 = pcVar2;
  if (sVar4 != 0) {
    pcVar1 = pcVar2 + sVar4;
    pcVar7 = pcVar2;
    do {
      pcVar8 = pcVar7;
      if (*pcVar7 == '*') break;
      pcVar7 = pcVar7 + 1;
      sVar4 = sVar4 - 1;
      pcVar8 = pcVar1;
    } while (sVar4 != 0);
  }
  local_58.text_ = pcVar2;
  local_58.text_len_ = (long)pcVar8 - (long)pcVar2;
  CTcFormalTypeList::decorate_name(this_00,&local_80,&local_58);
  pCVar5 = CTcPrsSymtab::find(G_prs->global_symtab_,local_80.text_,local_80.text_len_,
                              (CTcPrsSymtab **)0x0);
  if ((pCVar5 == (CTcSymbol *)0x0) ||
     (*(int *)&(pCVar5->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 != 1
     )) {
    CTcTokenizer::log_error(0x2d28,(long)pcVar8 - (long)pcVar2 & 0xffffffff,pcVar2);
  }
  else {
    (*(pCVar5->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x1b]
    )(pCVar5,(ulong)(uint)discard,argc,(ulong)(uint)varargs,named_args);
  }
  return;
}

Assistant:

void CTPNInh::gen_code_mminh(CTcSymFunc *func, int discard,
                             CTcPrsNode *prop_expr, int prop_is_expr,
                             int argc, int varargs,
                             CTcNamedArgs *named_args)
{
    /*
     *   If the function has an associated global symbol from a modification,
     *   use the global symbol instead.  The modified function doesn't have a
     *   real symbol, so we can't use it; but fortunately, the global symbol
     *   applies to all modified versions as well, since they all inherit
     *   from the same base function.  
     */
    while (func->get_mod_global() != 0)
        func = func->get_mod_global();

    /*
     *   There are two forms of inherited() for multi-methods.
     *   
     *   inherited<types>(args) - this form takes an explicit type list, to
     *   invoke a specific overridden version.
     *   
     *   inherited(args) - this form invokes the next inherited version,
     *   determined dynamically at run-time.  
     */
    if (typelist_ == 0)
    {
        /*
         *   It's the inherited(args) format.
         *   
         *   Call _multiMethodCallInherited(fromFunc, args).  We've already
         *   pushed the args list, so just add the source function argument
         *   (which is simply our defining function).  
         */
        func->gen_code(FALSE);

        /* look up _multiMethodCallInherited */
        CTcSymFunc *mmci = (CTcSymFunc *)G_prs->get_global_symtab()->find(
            "_multiMethodCallInherited", 25);

        if (mmci == 0 || mmci->get_type() != TC_SYM_FUNC)
        {
            /* undefined or incorrectly defined - log an error */
            G_tok->log_error(TCERR_MMINH_MISSING_SUPPORT_FUNC,
                             25, "_multiMethodCallInherited");
        }
        else
        {
            /* generate the call */
            mmci->gen_code_call(discard, argc + 1, varargs, named_args);
        }
    }
    else
    {
        /* 
         *   It's the inherited<types>(args) format.
         */

        /* 
         *   Get the base name for the function.  'func' is the decorated
         *   name for the containing function, which is of the form
         *   'Base*type1;type2...'.  The base name is the part up to the
         *   asterisk.  
         */
        const char *nm = func->getstr(), *p;
        size_t rem = func->getlen();
        for (p = nm ; rem != 0 && *p != '*' ; ++p, --rem) ;

        /* make a token for the base name */
        CTcToken btok;
        btok.set_text(nm, p - nm);
        
        /* build the decorated name for the target function */
        CTcToken dtok;
        typelist_->decorate_name(&dtok, &btok);

        /* look up the decorated name */
        CTcSymFunc *ifunc = (CTcSymFunc *)G_prs->get_global_symtab()->find(
            dtok.get_text(), dtok.get_text_len());

        /* if we found it, call it */
        if (ifunc != 0 && ifunc->get_type() == TC_SYM_FUNC)
        {
            /* generate the call */
            ifunc->gen_code_call(discard, argc, varargs, named_args);
        }
        else
        {
            /* function not found */
            G_tok->log_error(TCERR_MMINH_UNDEF_FUNC, (int)(p - nm), nm);
        }
    }
}